

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLExport.cpp
# Opt level: O0

bool __thiscall
ODDLParser::OpenDDLExport::writeValueArray(OpenDDLExport *this,DataArrayList *al,string *statement)

{
  long local_40;
  size_t idx;
  Value *nextValue;
  DataArrayList *nextDataArrayList;
  string *statement_local;
  DataArrayList *al_local;
  OpenDDLExport *this_local;
  
  if (al == (DataArrayList *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    nextValue = (Value *)al;
    if (al->m_numItems == 0) {
      this_local._7_1_ = true;
    }
    else {
      for (; nextValue != (Value *)0x0; nextValue = (Value *)nextValue->m_data) {
        if (nextValue != (Value *)0x0) {
          std::__cxx11::string::operator+=((string *)statement,"{ ");
          idx = nextValue->m_size;
          local_40 = 0;
          for (; idx != 0; idx = *(size_t *)(idx + 0x18)) {
            if (local_40 != 0) {
              std::__cxx11::string::operator+=((string *)statement,", ");
            }
            writeValue(this,(Value *)idx,statement);
            local_40 = local_40 + 1;
          }
          std::__cxx11::string::operator+=((string *)statement," }");
        }
      }
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool OpenDDLExport::writeValueArray( DataArrayList *al, std::string &statement ) {
    if (ddl_nullptr == al) {
        return false;
    }

    if (0 == al->m_numItems) {
        return true;
    }

    DataArrayList *nextDataArrayList = al ;
    while (ddl_nullptr != nextDataArrayList) {
        if (ddl_nullptr != nextDataArrayList) {
            statement += "{ ";
            Value *nextValue( nextDataArrayList->m_dataList );
            size_t idx( 0 );
            while (ddl_nullptr != nextValue) {
                if (idx > 0) {
                    statement += ", ";
                }
                writeValue( nextValue, statement );
                nextValue = nextValue->m_next;
                idx++;
            }
            statement += " }";
        }
        nextDataArrayList = nextDataArrayList->m_next;
    }

    return true;
}